

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_type.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::set_ssl_hostname_visitor::operator()
          (set_ssl_hostname_visitor *this,ssl_stream<libtorrent::socks5_stream> *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  SSL_CTX *pSVar2;
  allocator<char> local_61;
  host_name_verification local_60;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,this->hostname_,&local_61);
  paVar1 = &local_60.host_.field_2;
  local_60.host_._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,local_40,local_38 + (long)local_40);
  ssl_stream<libtorrent::socks5_stream>::
  set_verify_callback<boost::asio::ssl::host_name_verification>(s,&local_60,this->ec_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.host_._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.host_._M_dataplus._M_p,local_60.host_.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  this->ssl_ = (((s->m_sock)._M_t.
                 super___uniq_ptr_impl<boost::asio::ssl::stream<libtorrent::socks5_stream>,_std::default_delete<boost::asio::ssl::stream<libtorrent::socks5_stream>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_boost::asio::ssl::stream<libtorrent::socks5_stream>_*,_std::default_delete<boost::asio::ssl::stream<libtorrent::socks5_stream>_>_>
                 .
                 super__Head_base<0UL,_boost::asio::ssl::stream<libtorrent::socks5_stream>_*,_false>
                ._M_head_impl)->core_).engine_.ssl_;
  pSVar2 = SSL_get_SSL_CTX(*(SSL **)&(((s->m_sock)._M_t.
                                       super___uniq_ptr_impl<boost::asio::ssl::stream<libtorrent::socks5_stream>,_std::default_delete<boost::asio::ssl::stream<libtorrent::socks5_stream>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_boost::asio::ssl::stream<libtorrent::socks5_stream>_*,_std::default_delete<boost::asio::ssl::stream<libtorrent::socks5_stream>_>_>
                                       .
                                       super__Head_base<0UL,_boost::asio::ssl::stream<libtorrent::socks5_stream>_*,_false>
                                      ._M_head_impl)->core_).engine_);
  this->ctx_ = (context_handle_type)pSVar2;
  return;
}

Assistant:

void operator()(ssl_stream<T>& s)
		{
			s.set_verify_callback(ssl::host_name_verification(hostname_), *ec_);
			ssl_ = s.handle();
			ctx_ = s.context_handle();
		}